

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR arrayblockmerger(LispPTR base,LispPTR nbase)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  arrayblock *bnbase;
  arrayblock *bbase;
  ushort local_16;
  ushort local_14;
  DLword shaveback;
  DLword minblocksize;
  DLword secondbite;
  DLword narlens;
  DLword arlens;
  LispPTR nbase_local;
  LispPTR base_local;
  
  pLVar3 = NativeAligned4FromLAddr(base);
  pLVar4 = NativeAligned4FromLAddr(nbase);
  shaveback = (DLword)*pLVar3;
  local_14 = (ushort)*pLVar4;
  local_16 = -shaveback - 1;
  if (base + (uint)shaveback * 2 != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (local_16 < local_14) {
    shaveback = 0xffff;
    local_14 = local_14 - local_16;
    uVar1 = 4;
    if (*Hunk_word == 0x4c) {
      uVar1 = 0x42;
    }
    if (local_14 < uVar1) {
      shaveback = (local_14 - uVar1) - 1;
      local_16 = local_16 + (local_14 - uVar1);
      local_14 = uVar1;
    }
    LVar2 = makefreearrayblock(nbase + (uint)local_16 * 2,local_14);
    linkblock(LVar2);
    local_14 = 0;
  }
  LVar2 = makefreearrayblock(base,shaveback + local_14);
  LVar2 = linkblock(LVar2);
  return LVar2;
}

Assistant:

LispPTR arrayblockmerger(LispPTR base, LispPTR nbase) {
  DLword arlens, narlens, secondbite, minblocksize, shaveback;
  struct arrayblock *bbase, *bnbase;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  arlens = bbase->arlen;
  narlens = bnbase->arlen;
  secondbite = MAXARRAYBLOCKSIZE - arlens;
  /* There are three cases for merging the blocks
   * (1) the total size of the two blocks is less than max:
   *     merge into a single block
   * (2) creating a max size block leaves a viable leftover block:
   *     move the boundary to make a max block and a leftover block
   * (3) creating a max size block leaves a non-viable leftover block
   *     move the boundary to make a big block and a minimum size leftover block
   */
  if (base + (2 * arlens) != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (narlens > secondbite) { /* (2) or (3) */
    arlens = MAXARRAYBLOCKSIZE;
    narlens = narlens - secondbite;
    minblocksize =
        ((*Hunk_word == ATOM_T) ? (ARRAYBLOCKOVERHEADCELLS + MAXCELLSPERHUNK) : MINARRAYBLOCKSIZE);
    if (narlens < minblocksize) { /* (3) */
      shaveback = narlens - minblocksize;
      narlens = minblocksize;
      arlens += shaveback;
      secondbite += shaveback;
    }
    linkblock(makefreearrayblock(nbase + 2 * secondbite, narlens));
    narlens = 0;
  }
  return (linkblock(makefreearrayblock(base, arlens + narlens)));
}